

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

aiScene * __thiscall
Assimp::Importer::ReadFileFromMemory
          (Importer *this,void *pBuffer,size_t pLength,uint pFlags,char *pHint)

{
  size_t sVar1;
  MemoryIOSystem *this_00;
  void *num_bytes;
  char local_138 [8];
  char fbuff [228];
  IOSystem *io;
  char *local_38;
  char *pHint_local;
  uint pFlags_local;
  size_t pLength_local;
  void *pBuffer_local;
  Importer *this_local;
  
  local_38 = pHint;
  if (pHint == (char *)0x0) {
    local_38 = "";
  }
  if (((pBuffer != (void *)0x0) && (pLength != 0)) &&
     (num_bytes = pBuffer, sVar1 = strlen(local_38), sVar1 < 0xc9)) {
    unique0x00012000 = this->pimpl->mIOHandler;
    this->pimpl->mIOHandler = (IOSystem *)0x0;
    this_00 = (MemoryIOSystem *)
              Intern::AllocateFromAssimpHeap::operator_new
                        ((AllocateFromAssimpHeap *)0x50,(size_t)num_bytes);
    MemoryIOSystem::MemoryIOSystem(this_00,(uint8_t *)pBuffer,pLength,stack0xffffffffffffffb0);
    SetIOHandler(this,(IOSystem *)this_00);
    snprintf(local_138,0xe4,"%s.%s","$$$___magic___$$$",local_38);
    ReadFile(this,local_138,pFlags);
    SetIOHandler(this,stack0xffffffffffffffb0);
    return this->pimpl->mScene;
  }
  std::__cxx11::string::operator=
            ((string *)&this->pimpl->mErrorString,
             "Invalid parameters passed to ReadFileFromMemory()");
  return (aiScene *)0x0;
}

Assistant:

const aiScene* Importer::ReadFileFromMemory( const void* pBuffer,
    size_t pLength,
    unsigned int pFlags,
    const char* pHint /*= ""*/)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    if (!pHint) {
        pHint = "";
    }

    if (!pBuffer || !pLength || strlen(pHint) > MaxLenHint ) {
        pimpl->mErrorString = "Invalid parameters passed to ReadFileFromMemory()";
        return NULL;
    }

    // prevent deletion of the previous IOHandler
    IOSystem* io = pimpl->mIOHandler;
    pimpl->mIOHandler = NULL;

    SetIOHandler(new MemoryIOSystem((const uint8_t*)pBuffer,pLength,io));

    // read the file and recover the previous IOSystem
    static const size_t BufSize(Importer::MaxLenHint + 28);
    char fbuff[BufSize];
    ai_snprintf(fbuff, BufSize, "%s.%s",AI_MEMORYIO_MAGIC_FILENAME,pHint);

    ReadFile(fbuff,pFlags);
    SetIOHandler(io);

    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return pimpl->mScene;
}